

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::Optimize(BackwardPass *this)

{
  Phase PVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  PageAllocator *pageAllocator;
  char16_t *pcVar5;
  BasicBlock *local_228;
  BasicBlock *block;
  BasicBlock *blockStop;
  NumberTempRepresentativePropertySymMap localNumberTempRepresentativePropertySym;
  FloatSymEquivalenceMap localFloatSymEquivalenceMap;
  BVSparse<Memory::JitArenaAllocator> localConsiderSymsAsRealUsesInNoImplicitCallUses;
  BVSparse<Memory::JitArenaAllocator> localCandidateSymsRequiredToBeLossyInt;
  BVSparse<Memory::JitArenaAllocator> localCandidateSymsRequiredToBeInt;
  BVSparse<Memory::JitArenaAllocator> localIntOverflowDoesNotMatterInRangeBySymId;
  BVSparse<Memory::JitArenaAllocator> localIntOverflowDoesNotMatterBySymId;
  BVSparse<Memory::JitArenaAllocator> localSymUsedOnlyForNumberBySymId;
  BVSparse<Memory::JitArenaAllocator> localSymUsedOnlyForBitOpsBySymId;
  BVSparse<Memory::JitArenaAllocator> localNegativeZeroDoesNotMatterBySymId;
  undefined1 local_98 [8];
  NoRecoverMemoryJitArenaAllocator localAlloc;
  BackwardPass *this_local;
  
  localAlloc.super_JitArenaAllocator.bvFreeList = (BVSparseNode *)this;
  if (this->tag == BackwardPhase) {
    PVar1 = this->tag;
    uVar3 = Func::GetSourceContextId(this->func);
    uVar4 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,PVar1,uVar3,uVar4);
    if (bVar2) {
      return;
    }
  }
  if ((this->tag != CaptureByteCodeRegUsePhase) ||
     ((bVar2 = Js::PhaseIsEnabled::CaptureByteCodeRegUsePhase<Func*>(this->func), bVar2 &&
      (bVar2 = DoCaptureByteCodeUpwardExposedUsed(this), bVar2)))) {
    if (this->tag == DeadStorePhase) {
      bVar2 = Func::DoLoopFastPaths(this->func);
      if ((!bVar2) || (bVar2 = Func::DoFastPaths(this->func), !bVar2)) {
        Func::SetHasStackArgs(this->func,false);
      }
      InsertArgInsForFormals(this);
    }
    pcVar5 = L"BE-DeadStore";
    if (this->tag == BackwardPhase) {
      pcVar5 = L"BE-Backward";
    }
    pageAllocator =
         Memory::ArenaData::GetPageAllocator
                   (&(this->func->m_alloc->super_ArenaAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_ArenaData);
    Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)local_98,pcVar5,pageAllocator,
               Js::Throw::OutOfMemory);
    this->tempAlloc = (JitArenaAllocator *)local_98;
    bVar2 = IsTraceEnabled(this);
    if (bVar2) {
      Func::DumpHeader(this->func);
    }
    CleanupBackwardPassInfoInFlowGraph(this);
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField,this->tempAlloc);
    this->negativeZeroDoesNotMatterBySymId =
         (BVSparse<Memory::JitArenaAllocator> *)
         &localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField;
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField,this->tempAlloc);
    this->symUsedOnlyForBitOpsBySymId =
         (BVSparse<Memory::JitArenaAllocator> *)
         &localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField;
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField,this->tempAlloc);
    this->symUsedOnlyForNumberBySymId =
         (BVSparse<Memory::JitArenaAllocator> *)
         &localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField;
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localIntOverflowDoesNotMatterInRangeBySymId.lastUsedNodePrevNextField,
               this->tempAlloc);
    this->intOverflowDoesNotMatterBySymId =
         (BVSparse<Memory::JitArenaAllocator> *)
         &localIntOverflowDoesNotMatterInRangeBySymId.lastUsedNodePrevNextField;
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localCandidateSymsRequiredToBeInt.lastUsedNodePrevNextField,this->tempAlloc);
    this->intOverflowDoesNotMatterInRangeBySymId =
         (BVSparse<Memory::JitArenaAllocator> *)
         &localCandidateSymsRequiredToBeInt.lastUsedNodePrevNextField;
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localCandidateSymsRequiredToBeLossyInt.lastUsedNodePrevNextField,this->tempAlloc);
    this->candidateSymsRequiredToBeInt =
         (BVSparse<Memory::JitArenaAllocator> *)
         &localCandidateSymsRequiredToBeLossyInt.lastUsedNodePrevNextField;
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localConsiderSymsAsRealUsesInNoImplicitCallUses.lastUsedNodePrevNextField,
               this->tempAlloc);
    this->candidateSymsRequiredToBeLossyInt =
         (BVSparse<Memory::JitArenaAllocator> *)
         &localConsiderSymsAsRealUsesInNoImplicitCallUses.lastUsedNodePrevNextField;
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&localFloatSymEquivalenceMap.stats,
               this->tempAlloc);
    this->considerSymsAsRealUsesInNoImplicitCallUses =
         (BVSparse<Memory::JitArenaAllocator> *)&localFloatSymEquivalenceMap.stats;
    this->intOverflowCurrentlyMattersInRange = true;
    JsUtil::
    BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)&localNumberTempRepresentativePropertySym.stats,this->tempAlloc,0);
    this->floatSymEquivalenceMap =
         (FloatSymEquivalenceMap *)&localNumberTempRepresentativePropertySym.stats;
    JsUtil::
    BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)&blockStop,this->tempAlloc,0);
    this->numberTempRepresentativePropertySym = (NumberTempRepresentativePropertySymMap *)&blockStop
    ;
    for (local_228 = this->func->m_fg->tailBlock; local_228 != (BasicBlock *)0x0;
        local_228 = local_228->prev) {
      if (((*(ushort *)&local_228->field_0x18 & 1) == 0) ||
         ((*(ushort *)&local_228->field_0x18 >> 1 & 1) != 0)) {
        OptBlock(this,local_228);
      }
    }
    if (this->tag == DeadStorePhase) {
      uVar3 = Func::GetSourceContextId(this->func);
      uVar4 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MemOpPhase,uVar3,uVar4);
      if (!bVar2) {
        RemoveEmptyLoops(this);
      }
    }
    this->func->m_fg->hasBackwardPassInfo = true;
    bVar2 = DoTrackCompoundedIntOverflow(this);
    if (bVar2) {
      SymTable::ClearStackSymScratch(this->func->m_symTable);
    }
    PVar1 = this->tag;
    uVar3 = Func::GetSourceContextId(this->func);
    uVar4 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ebe7c8,PVar1,uVar3,uVar4);
    if (bVar2) {
      Func::DumpHeader(this->func);
      pcVar5 = L"Deadstore Phase Stats:\n";
      if (this->tag == BackwardPhase) {
        pcVar5 = L"Backward Phase Stats:\n";
      }
      Output::Print(pcVar5);
      bVar2 = DoDeadStore(this);
      if (bVar2) {
        Output::Print(L"  Deadstore              : %3d\n",(ulong)this->numDeadStore);
      }
      bVar2 = DoMarkTempNumbers(this);
      if (bVar2) {
        Output::Print(L"  Temp Number            : %3d\n",(ulong)this->numMarkTempNumber);
        Output::Print(L"  Transferred Temp Number: %3d\n",(ulong)this->numMarkTempNumberTransferred)
        ;
      }
      bVar2 = DoMarkTempObjects(this);
      if (bVar2) {
        Output::Print(L"  Temp Object            : %3d\n",(ulong)this->numMarkTempObject);
      }
    }
    JsUtil::
    BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)&blockStop);
    JsUtil::
    BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)&localNumberTempRepresentativePropertySym.stats);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&localFloatSymEquivalenceMap.stats);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localConsiderSymsAsRealUsesInNoImplicitCallUses.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localCandidateSymsRequiredToBeLossyInt.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localCandidateSymsRequiredToBeInt.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localIntOverflowDoesNotMatterInRangeBySymId.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField);
    Memory::NoRecoverMemoryJitArenaAllocator::~NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)local_98);
  }
  return;
}

Assistant:

void
BackwardPass::Optimize()
{
    if (tag == Js::BackwardPhase && PHASE_OFF(tag, this->func))
    {
        return;
    }

    if (tag == Js::CaptureByteCodeRegUsePhase && (!PHASE_ENABLED(CaptureByteCodeRegUsePhase, this->func) || !DoCaptureByteCodeUpwardExposedUsed()))
    {
        return;
    }

    if (tag == Js::DeadStorePhase)
    {
        if (!this->func->DoLoopFastPaths() || !this->func->DoFastPaths())
        {
            //arguments[] access is similar to array fast path hence disable when array fastpath is disabled.
            //loopFastPath is always true except explicitly disabled
            //defaultDoFastPath can be false when we the source code size is huge
            func->SetHasStackArgs(false);
        }
        InsertArgInsForFormals();
    }

    NoRecoverMemoryJitArenaAllocator localAlloc(tag == Js::BackwardPhase? _u("BE-Backward") : _u("BE-DeadStore"),
        this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);

    this->tempAlloc = &localAlloc;
#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        this->func->DumpHeader();
    }
#endif

    this->CleanupBackwardPassInfoInFlowGraph();

    // Info about whether a sym is used in a way in which -0 differs from +0, or whether the sym is used in a way in which an
    // int32 overflow when generating the value of the sym matters, in the current block. The info is transferred to
    // instructions that define the sym in the current block as they are encountered. The info in these bit vectors is discarded
    // after optimizing each block, so the only info that remains for GlobOpt is that which is transferred to instructions.
    BVSparse<JitArenaAllocator> localNegativeZeroDoesNotMatterBySymId(tempAlloc);
    negativeZeroDoesNotMatterBySymId = &localNegativeZeroDoesNotMatterBySymId;

    BVSparse<JitArenaAllocator> localSymUsedOnlyForBitOpsBySymId(tempAlloc);
    symUsedOnlyForBitOpsBySymId = &localSymUsedOnlyForBitOpsBySymId;
    BVSparse<JitArenaAllocator> localSymUsedOnlyForNumberBySymId(tempAlloc);
    symUsedOnlyForNumberBySymId = &localSymUsedOnlyForNumberBySymId;

    BVSparse<JitArenaAllocator> localIntOverflowDoesNotMatterBySymId(tempAlloc);
    intOverflowDoesNotMatterBySymId = &localIntOverflowDoesNotMatterBySymId;
    BVSparse<JitArenaAllocator> localIntOverflowDoesNotMatterInRangeBySymId(tempAlloc);
    intOverflowDoesNotMatterInRangeBySymId = &localIntOverflowDoesNotMatterInRangeBySymId;
    BVSparse<JitArenaAllocator> localCandidateSymsRequiredToBeInt(tempAlloc);
    candidateSymsRequiredToBeInt = &localCandidateSymsRequiredToBeInt;
    BVSparse<JitArenaAllocator> localCandidateSymsRequiredToBeLossyInt(tempAlloc);
    candidateSymsRequiredToBeLossyInt = &localCandidateSymsRequiredToBeLossyInt;
    BVSparse<JitArenaAllocator> localConsiderSymsAsRealUsesInNoImplicitCallUses(tempAlloc);
    considerSymsAsRealUsesInNoImplicitCallUses = &localConsiderSymsAsRealUsesInNoImplicitCallUses;
    intOverflowCurrentlyMattersInRange = true;

    FloatSymEquivalenceMap localFloatSymEquivalenceMap(tempAlloc);
    floatSymEquivalenceMap = &localFloatSymEquivalenceMap;

    NumberTempRepresentativePropertySymMap localNumberTempRepresentativePropertySym(tempAlloc);
    numberTempRepresentativePropertySym = &localNumberTempRepresentativePropertySym;

    FOREACH_BLOCK_BACKWARD_IN_FUNC_DEAD_OR_ALIVE(block, this->func)
    {
        this->OptBlock(block);
    }
    NEXT_BLOCK_BACKWARD_IN_FUNC_DEAD_OR_ALIVE;

    if (this->tag == Js::DeadStorePhase && !PHASE_OFF(Js::MemOpPhase, this->func))
    {
        this->RemoveEmptyLoops();
    }
    this->func->m_fg->hasBackwardPassInfo = true;

    if(DoTrackCompoundedIntOverflow())
    {
        // Tracking int overflow makes use of a scratch field in stack syms, which needs to be cleared
        func->m_symTable->ClearStackSymScratch();
    }

#if DBG_DUMP
    if (PHASE_STATS(this->tag, this->func))
    {
        this->func->DumpHeader();
        Output::Print(this->tag == Js::BackwardPhase? _u("Backward Phase Stats:\n") : _u("Deadstore Phase Stats:\n"));
        if (this->DoDeadStore())
        {
            Output::Print(_u("  Deadstore              : %3d\n"), this->numDeadStore);
        }
        if (this->DoMarkTempNumbers())
        {
            Output::Print(_u("  Temp Number            : %3d\n"), this->numMarkTempNumber);
            Output::Print(_u("  Transferred Temp Number: %3d\n"), this->numMarkTempNumberTransferred);
        }
        if (this->DoMarkTempObjects())
        {
            Output::Print(_u("  Temp Object            : %3d\n"), this->numMarkTempObject);
        }
    }
#endif
}